

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O2

bool tchecker::refdbm::is_sync_alu_le
               (db_t *rdbm1,db_t *rdbm2,reference_clock_variables_t *r,integer_t *l,integer_t *u)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  size_t sVar4;
  db_t *pdVar5;
  int iVar6;
  db_t *pdVar7;
  clock_id_t t;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  clock_id_t t_1;
  db_t *pdVar13;
  db_t min_tx1;
  db_t min_tx2;
  db_t local_78;
  db_t local_74;
  integer_t *local_70;
  long local_68;
  db_t *local_60;
  db_t *local_58;
  db_t *local_50;
  db_t *local_48;
  db_t *local_40;
  integer_t *local_38;
  
  local_38 = l;
  if (rdbm1 == (db_t *)0x0) {
    __assert_fail("rdbm1 != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x198,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  if (rdbm2 == (db_t *)0x0) {
    __assert_fail("rdbm2 != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x199,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  bVar3 = is_consistent(rdbm1,r);
  if (!bVar3) {
    __assert_fail("tchecker::refdbm::is_consistent(rdbm1, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x19a,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  bVar3 = is_consistent(rdbm2,r);
  if (!bVar3) {
    __assert_fail("tchecker::refdbm::is_consistent(rdbm2, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x19b,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  bVar3 = is_positive(rdbm1,r);
  if (!bVar3) {
    __assert_fail("tchecker::refdbm::is_positive(rdbm1, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x19c,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  bVar3 = is_positive(rdbm2,r);
  if (!bVar3) {
    __assert_fail("tchecker::refdbm::is_positive(rdbm2, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x19d,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  bVar3 = is_tight(rdbm1,r);
  if (!bVar3) {
    __assert_fail("tchecker::refdbm::is_tight(rdbm1, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x19e,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  bVar3 = is_tight(rdbm2,r);
  if (!bVar3) {
    __assert_fail("tchecker::refdbm::is_tight(rdbm2, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x19f,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  sVar4 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)r);
  uVar1 = r->_refcount;
  uVar10 = (ulong)uVar1;
  local_68 = sVar4 * 4;
  local_50 = rdbm1 + sVar4;
  local_58 = rdbm2 + sVar4;
  iVar6 = 0;
  local_70 = u;
  local_60 = rdbm2;
  for (uVar11 = uVar1; uVar12 = (ulong)uVar11, uVar12 < sVar4; uVar11 = uVar11 + 1) {
    iVar8 = u[uVar12 - uVar10];
    if (0x3ffffffe < iVar8) {
      __assert_fail("Ux < tchecker::dbm::INF_VALUE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                    ,0x1b7,
                    "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                   );
    }
    if (iVar8 != -0x3fffffff) {
      pdVar7 = local_58 + uVar12;
      local_40 = rdbm1 + uVar12;
      pdVar5 = local_40;
      if (uVar11 < uVar1) {
        pdVar5 = (db_t *)&tchecker::dbm::LT_INFINITY;
      }
      pdVar13 = local_50 + uVar12;
      min_tx1 = *pdVar5;
      for (uVar9 = 1; uVar9 < uVar10; uVar9 = uVar9 + 1) {
        pdVar5 = pdVar13;
        if (uVar11 < uVar1) {
          pdVar5 = (db_t *)&tchecker::dbm::LT_INFINITY;
        }
        min_tx1 = tchecker::dbm::min(&min_tx1,pdVar5);
        pdVar13 = (db_t *)(&pdVar13->field_0x0 + local_68);
      }
      min_tx2 = tchecker::dbm::db(LE,-iVar8);
      bVar3 = tchecker::dbm::operator<(&min_tx1,&min_tx2);
      u = local_70;
      if (!bVar3) {
        local_48 = local_60 + uVar12;
        pdVar5 = local_48;
        if (uVar11 < uVar1) {
          pdVar5 = (db_t *)&tchecker::dbm::LT_INFINITY;
        }
        min_tx2 = *pdVar5;
        for (uVar9 = 1; uVar9 < uVar10; uVar9 = uVar9 + 1) {
          pdVar5 = pdVar7;
          if (uVar11 < uVar1) {
            pdVar5 = (db_t *)&tchecker::dbm::LT_INFINITY;
          }
          min_tx2 = tchecker::dbm::min(&min_tx2,pdVar5);
          pdVar7 = (db_t *)(&pdVar7->field_0x0 + local_68);
        }
        bVar3 = tchecker::dbm::operator<(&min_tx2,&min_tx1);
        uVar9 = uVar10;
        iVar8 = iVar6;
        if (bVar3) break;
        for (; u = local_70, uVar9 < sVar4; uVar9 = (ulong)((int)uVar9 + 1)) {
          iVar2 = local_38[uVar9 - uVar10];
          if (0x3ffffffe < iVar2) {
            __assert_fail("Ly < tchecker::dbm::INF_VALUE",
                          "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                          ,0x1d1,
                          "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                         );
          }
          bVar3 = iVar8 != 0;
          iVar8 = iVar8 + -1;
          if ((bVar3) && (iVar2 != -0x3fffffff)) {
            pdVar7 = local_48 + sVar4 * uVar9;
            if (uVar11 < uVar1) {
              pdVar7 = (db_t *)&tchecker::dbm::LT_INFINITY;
            }
            pdVar5 = local_40 + sVar4 * uVar9;
            if (uVar11 < uVar1) {
              pdVar5 = (db_t *)&tchecker::dbm::LT_INFINITY;
            }
            bVar3 = tchecker::dbm::operator<(pdVar7,pdVar5);
            if (bVar3) {
              local_78 = tchecker::dbm::db(LT,-iVar2);
              local_74 = tchecker::dbm::sum(pdVar7,&local_78);
              bVar3 = tchecker::dbm::operator<(&local_74,&min_tx1);
              if (bVar3) goto LAB_00145b1b;
            }
          }
        }
      }
    }
    iVar6 = iVar6 + 1;
  }
LAB_00145b1b:
  return sVar4 <= uVar12;
}

Assistant:

bool is_sync_alu_le(tchecker::dbm::db_t const * rdbm1, tchecker::dbm::db_t const * rdbm2,
                    tchecker::reference_clock_variables_t const & r, tchecker::integer_t const * l,
                    tchecker::integer_t const * u)
{
  assert(rdbm1 != nullptr);
  assert(rdbm2 != nullptr);
  assert(tchecker::refdbm::is_consistent(rdbm1, r));
  assert(tchecker::refdbm::is_consistent(rdbm2, r));
  assert(tchecker::refdbm::is_positive(rdbm1, r));
  assert(tchecker::refdbm::is_positive(rdbm2, r));
  assert(tchecker::refdbm::is_tight(rdbm1, r));
  assert(tchecker::refdbm::is_tight(rdbm2, r));

  // We apply the technique described in appendix C of Govind Rajanbabu's PhD thesis
  // "Partial-order reduction for timed automata", Université de Bordeaux, 2021
  //
  // let dbm1=local_time_elapse(rdbm1), dbm2=local_time_elapse(rdbm2)
  //
  // Let min_tx1 = min {dbm1[t,x] | t ref clock, x offset clock}
  // and min_tx2 = min {dbm2[t,x] | t ref clock, x offset clock}
  //
  // dbm1 not included in aLU(dbm2) if:
  // - either there is an offset clock x s.t.
  //     min_tx1 >= (<= -U(x))
  // &&  min_tx2 < min_tx1
  // - or there are two offset clocks x and y s.t.
  //     min_tx1 >= (<= -U(x))
  // &&  dbm2[y,x] < dbm1[y,x]
  // &&  dbm2[y,x] + (< -L(y)) < min_tx1

  std::size_t const rdim = r.size();
  std::size_t const refcount = r.refcount();

  for (tchecker::clock_id_t x = refcount; x < rdim; ++x) {
    tchecker::integer_t Ux = U(x);
    assert(Ux < tchecker::dbm::INF_VALUE);

    // Skip x as 1st condition cannot be satisfied
    if (Ux == -tchecker::dbm::INF_VALUE)
      continue;

    // Compute min_tx1 = min {dbm1[t,x] | t ref clock}
    tchecker::dbm::db_t min_tx1 = LTE_RDBM1(0, x);
    for (tchecker::clock_id_t t = 1; t < refcount; ++t)
      min_tx1 = tchecker::dbm::min(min_tx1, LTE_RDBM1(t, x));

    // Check 1st condition
    if (min_tx1 < tchecker::dbm::db(tchecker::LE, -Ux))
      continue;

    // Compute min_tx2 = min {dbm2[t,x] | t ref clock}
    tchecker::dbm::db_t min_tx2 = LTE_RDBM2(0, x);
    for (tchecker::clock_id_t t = 1; t < refcount; ++t)
      min_tx2 = tchecker::dbm::min(min_tx2, LTE_RDBM2(t, x));

    // Check 2nd condition (of first case above)
    if (min_tx2 < min_tx1)
      return false;

    for (tchecker::clock_id_t y = refcount; y < rdim; ++y) {
      tchecker::integer_t Ly = L(y);
      assert(Ly < tchecker::dbm::INF_VALUE);

      if (x == y)
        continue;

      // Skip y as 3rd condition cannot be satisfied
      if (Ly == -tchecker::dbm::INF_VALUE)
        continue;

      // Check 2nd and 3rd conditions (of second case above)
      if (LTE_RDBM2(y, x) < LTE_RDBM1(y, x) &&
          tchecker::dbm::sum(LTE_RDBM2(y, x), tchecker::dbm::db(tchecker::LT, -Ly)) < min_tx1)
        return false;
    }
  }

  return true;
}